

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void ORPG::Core::PRINT_BASIC_HELP(void)

{
  fputs("openrpg v0.6.0 - (C) 2016-2025 Nicholas Gaulke\nOpenRPG Software License - Version 1.0 - February 10th, 2017 <https://openrpg.io/about/license/>\nThis is free software: you are free to change and redistribute it.\nThere is NO WARRANTY, to the extent permitted by law.\n\nUsage: orpg > [command]\n\nAvailable commands:\n\texit (quit, q)                       Exit OpenRPG.\n\thelp (h) [module]                    Print the help screen for the given module. Omitting a\n\t                                         module prints this help menu.\n\tversion (ver, v | V)                 Print version info.\n\nAvailable modules:\n\tgenerate (gen, ng) [RACE | GENDER]   Generate a random name of the given RACE and GENDER.\n\troll (r) [XdY]                       Simulates rolling dice with Y sides X number of times.\n\nLong options may not be passed with a single dash.\nOpenRPG home page: <https://openrpg.io>\nReport bugs to: <https://github.com/incomingstick/OpenRPG/issues>\nSee \'man openrpg\' for more information [TODO add man pages].\n"
        ,_stdout);
  return;
}

Assistant:

void PRINT_BASIC_HELP() {
            fputs("openrpg " VERSION " - " COPYRIGHT "\n"
                "OpenRPG Software License - Version 1.0 - February 10th, 2017 <https://openrpg.io/about/license/>\n"
                "This is free software: you are free to change and redistribute it.\n"
                "There is NO WARRANTY, to the extent permitted by law.\n"
                "\n"
                "Usage: orpg > [command]\n"
                "\n"
                "Available commands:\n"
                        "\texit (quit, q)                       Exit OpenRPG.\n"
                        "\thelp (h) [module]                    Print the help screen for the given module. Omitting a\n"
                        "\t                                         module prints this help menu.\n"
                        "\tversion (ver, v | V)                 Print version info.\n"
                "\n"
                "Available modules:\n"
                        "\tgenerate (gen, ng) [RACE | GENDER]   Generate a random name of the given RACE and GENDER.\n"
                        "\troll (r) [XdY]                       Simulates rolling dice with Y sides X number of times.\n"
                "\n"
                "Long options may not be passed with a single dash.\n"
                "OpenRPG home page: <https://openrpg.io>\n"
                "Report bugs to: <https://github.com/incomingstick/OpenRPG/issues>\n"
                "See 'man openrpg' for more information [TODO add man pages].\n",
                stdout);
        }